

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cumain.cpp
# Opt level: O1

void cu_stop_tracing(int param_1)

{
  char **ppcVar1;
  ulong *puVar2;
  bool bVar3;
  long lVar4;
  bool bVar5;
  vector<Sample,_std::allocator<Sample>_> *pvVar6;
  map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar7;
  uint uVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  char *pcVar12;
  FILE *pFVar13;
  tm *__tp;
  size_t sVar14;
  undefined8 *puVar15;
  _Rb_tree_header *p_Var16;
  mapped_type *pmVar17;
  _Base_ptr p_Var18;
  ulong uVar19;
  ulong uVar20;
  byte bVar21;
  _Base_ptr p_Var22;
  pointer pSVar23;
  ulong uVar24;
  uint __len;
  char timestr [26];
  time_t global_time;
  utsname uts;
  char default_path [32];
  ushort *local_298;
  long local_290;
  ushort local_288 [8];
  char **local_278;
  long local_270;
  char *local_268;
  long lStack_260;
  ulong *local_250;
  long local_248;
  ulong local_240 [2];
  char **local_230;
  long local_228;
  char *local_220 [2];
  FILE *local_210;
  ulong *local_208;
  undefined8 local_200;
  ulong local_1f8;
  undefined8 uStack_1f0;
  pointer local_1e8;
  utsname local_1e0;
  char local_58 [40];
  
  LOCK();
  tracing_enabled._M_base._M_i = (__atomic_base<bool>)false;
  UNLOCK();
  if (samples == (vector<Sample,_std::allocator<Sample>_> *)0x0) {
    tracing_enabled = (atomic<bool>)0x0;
    return;
  }
  if (symbols_abi_cxx11_ ==
      (map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)0x0) {
    tracing_enabled = (atomic<bool>)0x0;
    return;
  }
  pcVar12 = getenv("CU_FILE");
  if (pcVar12 == (char *)0x0) {
    uVar10 = getpid();
    pcVar12 = local_58;
    snprintf(pcVar12,0x20,"./culog-%d.json",(ulong)uVar10);
  }
  pFVar13 = fopen(pcVar12,"w");
  if (pFVar13 == (FILE *)0x0) {
    fprintf(_stderr,"cpuusage: unable to write to output path \'%s\'\n",pcVar12);
    goto LAB_00103f3a;
  }
  fwrite("{\n",2,1,pFVar13);
  fwrite("\"otherData\": {\n",0xf,1,pFVar13);
  time((time_t *)&local_250);
  __tp = localtime((time_t *)&local_250);
  strftime((char *)&local_278,0x1a,"%Y-%m-%d %H:%M:%S %z",__tp);
  local_1e0.sysname._0_8_ = local_1e0.sysname + 0x10;
  sVar14 = strlen((char *)&local_278);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e0,&local_278,(long)&local_278 + sVar14);
  fprintf(pFVar13,"  \"timestamp\":\"%s\",\n",local_1e0.sysname._0_8_);
  if ((char *)local_1e0.sysname._0_8_ != local_1e0.sysname + 0x10) {
    operator_delete((void *)local_1e0.sysname._0_8_);
  }
  iVar11 = uname(&local_1e0);
  local_210 = pFVar13;
  if (iVar11 == 0) {
    local_250 = local_240;
    sVar14 = strlen(local_1e0.sysname);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_250,&local_1e0,local_1e0.sysname + sVar14);
    local_288[0] = 0x20;
    local_290 = 1;
    uVar20 = 0xf;
    if (local_250 != local_240) {
      uVar20 = local_240[0];
    }
    local_298 = local_288;
    if ((local_248 + 1U < 0x10) && (uVar20 < local_248 + 1U)) {
      puVar15 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_250);
    }
    else {
      puVar15 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_288);
    }
    local_278 = &local_268;
    ppcVar1 = (char **)(puVar15 + 2);
    if ((char **)*puVar15 == ppcVar1) {
      local_268 = *ppcVar1;
      lStack_260 = puVar15[3];
    }
    else {
      local_268 = *ppcVar1;
      local_278 = (char **)*puVar15;
    }
    local_270 = puVar15[1];
    *puVar15 = ppcVar1;
    puVar15[1] = 0;
    *(undefined1 *)ppcVar1 = 0;
    local_230 = local_220;
    sVar14 = strlen(local_1e0.release);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_230,local_1e0.release,local_1e0.release + sVar14);
    pcVar12 = (char *)0xf;
    if (local_278 != &local_268) {
      pcVar12 = local_268;
    }
    if (pcVar12 < (char *)(local_228 + local_270)) {
      pcVar12 = (char *)0xf;
      if (local_230 != local_220) {
        pcVar12 = local_220[0];
      }
      if (pcVar12 < (char *)(local_228 + local_270)) goto LAB_00103942;
      puVar15 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,(ulong)local_278);
    }
    else {
LAB_00103942:
      puVar15 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_230);
    }
    local_208 = &local_1f8;
    puVar2 = puVar15 + 2;
    if ((ulong *)*puVar15 == puVar2) {
      local_1f8 = *puVar2;
      uStack_1f0 = puVar15[3];
    }
    else {
      local_1f8 = *puVar2;
      local_208 = (ulong *)*puVar15;
    }
    local_200 = puVar15[1];
    *puVar15 = puVar2;
    puVar15[1] = 0;
    *(undefined1 *)puVar2 = 0;
    if (local_230 != local_220) {
      operator_delete(local_230);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278);
    }
    if (local_298 != local_288) {
      operator_delete(local_298);
    }
    if (local_250 != local_240) {
      operator_delete(local_250);
    }
  }
  else {
    local_208 = &local_1f8;
    local_200 = 0;
    local_1f8 = local_1f8 & 0xffffffffffffff00;
  }
  pFVar13 = local_210;
  fprintf(local_210,"  \"os\":\"%s\",\n",local_208);
  if (local_208 != &local_1f8) {
    operator_delete(local_208);
  }
  uVar10 = std::thread::hardware_concurrency();
  fprintf(pFVar13,"  \"cores\":\"%d\"\n",(ulong)uVar10);
  fwrite("},\n",3,1,pFVar13);
  fwrite("\"traceEvents\": [\n",0x11,1,pFVar13);
  uVar10 = getpid();
  pSVar23 = (samples->super__Vector_base<Sample,_std::allocator<Sample>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_1e8 = (samples->super__Vector_base<Sample,_std::allocator<Sample>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  if (pSVar23 != local_1e8) {
    bVar9 = true;
    do {
      if (bVar9) {
        fwrite("  ",2,1,pFVar13);
        bVar9 = false;
      }
      else {
        fwrite(",\n  ",4,1,pFVar13);
      }
      bVar3 = pSVar23->enter;
      local_230 = (char **)pSVar23->func;
      local_290 = 0;
      local_288[0] = local_288[0] & 0xff00;
      p_Var16 = &(symbols_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header;
      p_Var22 = (symbols_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var18 = &p_Var16->_M_header;
      for (; p_Var22 != (_Base_ptr)0x0;
          p_Var22 = (&p_Var22->_M_left)[*(char ***)(p_Var22 + 1) < local_230]) {
        if (*(char ***)(p_Var22 + 1) >= local_230) {
          p_Var18 = p_Var22;
        }
      }
      p_Var22 = &p_Var16->_M_header;
      if (((_Rb_tree_header *)p_Var18 != p_Var16) &&
         (p_Var22 = p_Var18, local_230 < *(char ***)(p_Var18 + 1))) {
        p_Var22 = &p_Var16->_M_header;
      }
      local_298 = local_288;
      if ((_Rb_tree_header *)p_Var22 == p_Var16) {
        iVar11 = dladdr(local_230,&local_278);
        if (local_268 == (char *)0x0 || iVar11 == 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)&local_1e0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1e0.sysname + 0x10),"0x",2);
          lVar4 = *(long *)(CONCAT44(local_1e0.sysname._20_4_,
                                     CONCAT13(local_1e0.sysname[0x13],
                                              CONCAT12(local_1e0.sysname[0x12],
                                                       local_1e0.sysname._16_2_))) + -0x18);
          *(uint *)(local_1e0.sysname + lVar4 + 0x28) =
               *(uint *)(local_1e0.sysname + lVar4 + 0x28) & 0xffffffb5 | 8;
          std::ostream::_M_insert<unsigned_long_long>((ulonglong)(local_1e0.sysname + 0x10));
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)&local_298,(string *)&local_250);
          if (local_250 != local_240) {
            operator_delete(local_250);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&local_1e0);
          std::ios_base::~ios_base((ios_base *)(local_1e0.nodename + 0x3f));
        }
        else {
          if (*local_268 == '_') {
            local_250 = (ulong *)CONCAT44(local_250._4_4_,0xffffffff);
            pcVar12 = (char *)__cxa_demangle(local_268,0,0,&local_250);
            if (pcVar12 != (char *)0x0) {
              if ((int)local_250 == 0) {
                local_1e0.sysname._0_8_ = local_1e0.sysname + 0x10;
                sVar14 = strlen(pcVar12);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1e0,pcVar12,pcVar12 + sVar14);
                std::__cxx11::string::operator=((string *)&local_298,(string *)&local_1e0);
                if ((char *)local_1e0.sysname._0_8_ != local_1e0.sysname + 0x10) {
                  operator_delete((void *)local_1e0.sysname._0_8_);
                }
              }
              free(pcVar12);
            }
          }
          if (local_290 == 0) {
            std::__cxx11::string::string((string *)&local_1e0,local_268,(allocator *)&local_250);
            std::__cxx11::string::operator=((string *)&local_298,(string *)&local_1e0);
            if ((char *)local_1e0.sysname._0_8_ != local_1e0.sysname + 0x10) {
              operator_delete((void *)local_1e0.sysname._0_8_);
            }
          }
          if (local_290 != 0) {
            pcVar12 = local_1e0.sysname + 0x10;
            builtin_strncpy(local_1e0.sysname + 0x10," + ",4);
            local_1e0.sysname[8] = '\x03';
            local_1e0.sysname[9] = '\0';
            local_1e0.sysname[10] = '\0';
            local_1e0.sysname[0xb] = '\0';
            local_1e0.sysname[0xc] = '\0';
            local_1e0.sysname[0xd] = '\0';
            local_1e0.sysname[0xe] = '\0';
            local_1e0.sysname[0xf] = '\0';
            local_1e0.sysname._0_8_ = pcVar12;
            std::__cxx11::string::_M_append((char *)&local_298,(ulong)pcVar12);
            if ((char *)local_1e0.sysname._0_8_ != pcVar12) {
              operator_delete((void *)local_1e0.sysname._0_8_);
            }
            uVar24 = (long)local_230 - lStack_260;
            uVar20 = -uVar24;
            if (0 < (long)uVar24) {
              uVar20 = uVar24;
            }
            __len = 1;
            if (9 < uVar20) {
              uVar19 = uVar20;
              uVar8 = 4;
              do {
                __len = uVar8;
                if (uVar19 < 100) {
                  __len = __len - 2;
                  goto LAB_00103e05;
                }
                if (uVar19 < 1000) {
                  __len = __len - 1;
                  goto LAB_00103e05;
                }
                if (uVar19 < 10000) goto LAB_00103e05;
                bVar5 = 99999 < uVar19;
                uVar19 = uVar19 / 10000;
                uVar8 = __len + 4;
              } while (bVar5);
              __len = __len + 1;
            }
LAB_00103e05:
            local_1e0.sysname._0_8_ = local_1e0.sysname + 0x10;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_1e0,(char)__len - (char)((long)uVar24 >> 0x3f));
            std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)(local_1e0.sysname._0_8_ + -((long)uVar24 >> 0x3f)),__len,uVar20);
            std::__cxx11::string::_M_append((char *)&local_298,local_1e0.sysname._0_8_);
            pFVar13 = local_210;
            if ((char *)local_1e0.sysname._0_8_ != local_1e0.sysname + 0x10) {
              operator_delete((void *)local_1e0.sysname._0_8_);
            }
          }
        }
        pmVar17 = std::
                  map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](symbols_abi_cxx11_,&local_230);
        std::__cxx11::string::_M_assign((string *)pmVar17);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&local_298);
      }
      bVar21 = bVar3 ^ 1;
      fprintf(pFVar13,
              "{ \"ph\":\"%c\", \"cat\":\"perf\", \"pid\":\"%d\", \"tid\":\"%p\", \"name\":\"%s\", \"ts\":%ld }"
              ,(ulong)((uint)bVar21 + (uint)bVar21 * 2 + 0x42),(ulong)uVar10,pSVar23->thread,
              local_298,pSVar23->ts);
      if (local_298 != local_288) {
        operator_delete(local_298);
      }
      pSVar23 = pSVar23 + 1;
    } while (pSVar23 != local_1e8);
  }
  fputc(10,pFVar13);
  fwrite("]\n",2,1,pFVar13);
  fwrite("}\n",2,1,pFVar13);
  fclose(pFVar13);
LAB_00103f3a:
  pvVar6 = samples;
  if (samples != (vector<Sample,_std::allocator<Sample>_> *)0x0) {
    pSVar23 = (samples->super__Vector_base<Sample,_std::allocator<Sample>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (pSVar23 != (pointer)0x0) {
      operator_delete(pSVar23);
    }
    operator_delete(pvVar6);
  }
  pmVar7 = symbols_abi_cxx11_;
  if (symbols_abi_cxx11_ !=
      (map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)0x0) {
    std::
    _Rb_tree<void_*,_std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&symbols_abi_cxx11_->_M_t);
    operator_delete(pmVar7);
  }
  count_samples = 0;
  symbols_abi_cxx11_ =
       (map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)0x0;
  samples = (vector<Sample,_std::allocator<Sample>_> *)0x0;
  return;
}

Assistant:

static void cu_stop_tracing(int)
{
  tracing_enabled = false;

  if ((samples != NULL) && (symbols != NULL))
  {
    cu_trace_report();
    delete samples;
    delete symbols;
    samples = NULL;
    symbols = NULL;
    count_samples = 0;
  }
}